

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

float xm_period(xm_context_t *ctx,float note)

{
  long in_RDI;
  float in_XMM0_Da;
  undefined4 local_4;
  
  if (*(int *)(in_RDI + 0x14) == 0) {
    local_4 = xm_linear_period(in_XMM0_Da);
  }
  else if (*(int *)(in_RDI + 0x14) == 1) {
    local_4 = xm_amiga_period(in_XMM0_Da);
  }
  else {
    local_4 = 0.0;
  }
  return local_4;
}

Assistant:

static float xm_period(xm_context_t* ctx, float note) {
	switch(ctx->module.frequency_type) {
	case XM_LINEAR_FREQUENCIES:
		return xm_linear_period(note);
	case XM_AMIGA_FREQUENCIES:
		return xm_amiga_period(note);
	}
	return .0f;
}